

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertFromStruct
          (ElementsDecodeRawTransactionTxOut *this,ElementsDecodeRawTransactionTxOutStruct *data)

{
  undefined4 uVar1;
  ElementsDecodeLockingScript *in_RSI;
  ElementsDecodeLockingScriptStruct *in_RDI;
  
  *(_func_int ***)&in_RDI->field_0x38 =
       (in_RSI->super_JsonClassBase<cfd::api::json::ElementsDecodeLockingScript>).
       _vptr_JsonClassBase;
  uVar1 = *(undefined4 *)&(in_RSI->ignore_items)._M_t._M_impl.field_0x4;
  in_RDI->req_sigs = *(undefined4 *)&(in_RSI->ignore_items)._M_t._M_impl.field_0x0;
  *(undefined4 *)&in_RDI->field_0x44 = uVar1;
  *(undefined8 *)&in_RDI->type =
       *(undefined8 *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
  *(undefined4 *)&in_RDI->field_0x50 =
       *(undefined4 *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
  ;
  *(undefined4 *)&in_RDI->field_0x54 =
       *(undefined4 *)
        ((long)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 4);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->field_0x58,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  std::__cxx11::string::operator=
            ((string *)
             &(in_RDI->addresses).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&in_RSI->field_0x40);
  std::__cxx11::string::operator=((string *)&in_RDI->field_0x98,(string *)&in_RSI->field_0x60);
  std::__cxx11::string::operator=((string *)&in_RDI->field_0xb8,(string *)&in_RSI->type_);
  std::__cxx11::string::operator=((string *)&in_RDI->field_0xd8,(string *)&in_RSI->addresses_);
  in_RDI->field_0xf8 = (byte)in_RSI->pegout_chain_ & 1;
  *(undefined4 *)&in_RDI->field_0xfc = *(undefined4 *)&in_RSI->field_0xc4;
  ElementsDecodeLockingScript::ConvertFromStruct(in_RSI,in_RDI);
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[1].pegout_addresses.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)
             &in_RSI[1].addresses_.
              super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxOut::ConvertFromStruct(
    const ElementsDecodeRawTransactionTxOutStruct& data) {
  value_ = data.value;
  value_minimum_ = data.value_minimum;
  value_maximum_ = data.value_maximum;
  ct_exponent_ = data.ct_exponent;
  ct_bits_ = data.ct_bits;
  surjectionproof_ = data.surjectionproof;
  valuecommitment_ = data.valuecommitment;
  asset_ = data.asset;
  assetcommitment_ = data.assetcommitment;
  commitmentnonce_ = data.commitmentnonce;
  commitmentnonce_fully_valid_ = data.commitmentnonce_fully_valid;
  n_ = data.n;
  script_pub_key_.ConvertFromStruct(data.script_pub_key);
  rangeproof_ = data.rangeproof;
  ignore_items = data.ignore_items;
}